

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O2

float sensitivity(ftrl *b,base_learner *param_2,example *ec)

{
  uncertainty local_18;
  
  local_18.pred = 0.0;
  local_18.score = 0.0;
  local_18.b = b;
  GD::foreach_feature<uncertainty,_float_&,_&predict_with_confidence>(b->all,ec,&local_18);
  return local_18.score;
}

Assistant:

float sensitivity(ftrl& b, base_learner& /* base */, example& ec)
{
  uncertainty uncetain(b);
  GD::foreach_feature<uncertainty, predict_with_confidence>(*(b.all), ec, uncetain);
  return uncetain.score;
}